

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::x86::X86RAPass::emitPreCall(X86RAPass *this,InvokeNode *invokeNode)

{
  uint uVar1;
  BaseBuilder *this_00;
  Error EVar2;
  uint uVar3;
  undefined8 extraout_RAX;
  undefined1 *puVar4;
  InstId instId;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Xmm src;
  Operand_ local_58;
  ulong local_48;
  Operand_ local_40;
  
  if (invokeNode->field_0xf5 == -1) {
    return 0;
  }
  this_00 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  if (((this_00->super_BaseEmitter)._environment._arch & k32BitMask) != kUnknown) {
    return 0;
  }
  uVar5 = (ulong)(byte)invokeNode->field_0xf4;
  if (invokeNode->field_0x81 != ' ') {
    if (invokeNode->field_0x81 != '!') {
      return 3;
    }
    if (uVar5 == 0) {
      return 0;
    }
    puVar4 = &invokeNode->field_0x11c;
    uVar7 = 0;
    local_48 = uVar5;
    while (uVar7 != 0x20) {
      lVar6 = 0;
      do {
        uVar3 = *(uint *)(puVar4 + lVar6 * 4);
        if (uVar3 == 0) break;
        if ((uVar3 >> 8 & 1) != 0) {
          if (0x1fffffff < uVar3) goto LAB_001498e8;
          if ((*(uint *)(_archTraits + (ulong)(uVar3 >> 0x18) * 4 + 0xec) & 0xf00) == 0x100) {
            local_58._baseId._0_1_ = (&invokeNode->field_0xb4)[uVar7];
            local_58._signature._bits = 0x8000039;
            local_58._baseId._1_3_ = 0;
            local_58._data[0] = 0;
            local_58._data[1] = 0;
            local_40._baseId = uVar3 >> 0x10 & 0xff;
            local_40._signature._bits = 0x10000161;
            local_40._data[0] = 0;
            local_40._data[1] = 0;
            instId = 0x1d3;
            if ((this->_emitHelper)._avxEnabled != false) {
              instId = 0x4c0;
            }
            EVar2 = BaseEmitter::_emitI(&((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->
                                         super_BaseEmitter,instId,&local_58,&local_40);
            if (EVar2 != 0) {
              return EVar2;
            }
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      uVar7 = uVar7 + 1;
      puVar4 = puVar4 + 0x10;
      if (uVar7 == local_48) {
        return 0;
      }
    }
    goto LAB_001498f2;
  }
  if (uVar5 != 0) {
    puVar4 = &invokeNode->field_0x11c;
    uVar7 = 0;
    uVar3 = 0;
    do {
      if (uVar7 == 0x20) goto LAB_001498ed;
      lVar6 = 0;
      do {
        uVar1 = *(uint *)(puVar4 + lVar6 * 4);
        if (uVar1 == 0) break;
        if ((uVar1 >> 8 & 1) != 0) {
          if (uVar1 < 0x20000000) {
            uVar3 = uVar3 + ((*(uint *)(_archTraits + (ulong)(uVar1 >> 0x18) * 4 + 0xec) & 0xf00) ==
                            0x100);
            goto LAB_0014987a;
          }
          emitPreCall();
LAB_001498e8:
          emitPreCall();
          goto LAB_001498ed;
        }
LAB_0014987a:
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      uVar7 = uVar7 + 1;
      puVar4 = puVar4 + 0x10;
    } while (uVar7 != uVar5);
    if (uVar3 != 0) {
      local_58._signature._bits = 4;
      local_58._baseId = 0;
      local_58._data[1] = 0;
      local_58._data[0] = uVar3;
      EVar2 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,0x1b7,(Operand_ *)regs::eax,&local_58)
      ;
      goto LAB_001498ce;
    }
  }
  EVar2 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,0x6a8,(Operand_ *)regs::eax,
                              (Operand_ *)regs::eax);
LAB_001498ce:
  if (EVar2 == 0) {
    return 0;
  }
  return EVar2;
LAB_001498ed:
  emitPreCall();
LAB_001498f2:
  emitPreCall();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

Error X86RAPass::emitPreCall(InvokeNode* invokeNode) noexcept {
  if (invokeNode->detail().hasVarArgs() && cc()->is64Bit()) {
    const FuncDetail& fd = invokeNode->detail();
    uint32_t argCount = invokeNode->argCount();

    switch (invokeNode->detail().callConv().id()) {
      case CallConvId::kX64SystemV: {
        // AL register contains the number of arguments passed in XMM register(s).
        uint32_t n = 0;
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec)
              n++;
          }
        }

        if (!n)
          ASMJIT_PROPAGATE(cc()->xor_(eax, eax));
        else
          ASMJIT_PROPAGATE(cc()->mov(eax, n));
        break;
      }

      case CallConvId::kX64Windows: {
        // Each double-precision argument passed in XMM must be also passed in GP.
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec) {
              Gp dst = gpq(fd.callConv().passedOrder(RegGroup::kGp)[argIndex]);
              Xmm src = xmm(arg.regId());
              ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), dst, src));
            }
          }
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }
  }

  return kErrorOk;
}